

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O2

bool bgp_update_handle_path_attribute
               (bgp_peer *peer,uchar *buff,uint16_t unfeasible_routes_length,
               uint16_t total_path_attribute_length,adj_ribs_in_data *route_data)

{
  byte bVar1;
  in_addr __in;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  log_level lVar5;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  uchar *args;
  uint *args_00;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  ulong uVar9;
  int iVar10;
  log_level level;
  uint32_t uVar11;
  uint8_t segment_type;
  uint8_t segment_length;
  uint8_t type;
  adj_ribs_in_data *local_218;
  uint local_210;
  int local_20c;
  string as_list_str;
  uint local_1e4;
  uchar *local_1e0;
  bgp_peer *local_1d8;
  uchar *local_1d0;
  string local_1c8 [32];
  uint8_t origin;
  undefined7 uStack_1a7;
  
  iVar10 = (int)CONCAT62(in_register_00000012,unfeasible_routes_length);
  iVar6 = iVar10 + (int)CONCAT62(in_register_0000000a,total_path_attribute_length) + 0x17;
  iVar10 = iVar10 + 0x17;
  local_1d0 = buff + 2;
  local_218 = route_data;
  local_20c = iVar6;
  local_1e0 = buff;
  local_1d8 = peer;
  do {
    if (iVar6 <= iVar10) {
      return true;
    }
    type = buff[(long)iVar10 + 1];
    level = INFO;
    if ((buff[iVar10] & 0x10) == 0) {
      local_210 = (uint)buff[(long)iVar10 + 2];
      lVar5 = INFO;
    }
    else {
      local_210 = (uint)(ushort)(*(ushort *)(buff + (long)iVar10 + 2) << 8 |
                                *(ushort *)(buff + (long)iVar10 + 2) >> 8);
      lVar5 = DEBUG;
    }
    iVar10 = iVar10 + lVar5;
    if (0x10 < type - 1) {
switchD_0010f6bd_caseD_8:
      pcVar7 = "Unhandled path attributes type %d";
      args = &type;
      level = INFO;
LAB_0010f906:
      log<unsigned_char>(level,pcVar7,args);
      goto LAB_0010fa91;
    }
    switch((uint)type) {
    case 1:
      _origin = (char *)CONCAT71(uStack_1a7,buff[iVar10]);
      (local_218->path_attr).origin = buff[iVar10];
      pcVar7 = "Origin %d";
      args = &origin;
      goto LAB_0010f906;
    case 2:
      segment_type = buff[iVar10];
      segment_length = buff[(long)iVar10 + 1];
      if (segment_type != '\x02') {
LAB_0010f8f7:
        level = DEBUG;
        pcVar7 = "Unable to interpret segment type %d";
        args = &segment_type;
        goto LAB_0010f906;
      }
      as_list_str._M_dataplus._M_p = (pointer)&as_list_str.field_2;
      as_list_str._M_string_length = 0;
      as_list_str.field_2._M_local_buf[0] = '\0';
      bVar8 = false;
      for (uVar9 = 0; uVar9 < segment_length; uVar9 = uVar9 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&origin);
        std::__cxx11::string::append((char *)&as_list_str);
        if (local_1d8->is_4_octet_as_supported == true) {
          uVar4 = *(uint *)(buff + uVar9 * 4 + (long)(iVar10 + 2));
          uVar11 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          std::ostream::_M_insert<unsigned_long>((ulong)&origin);
          bVar1 = (local_218->path_attr).as_path_length;
        }
        else {
          uVar3 = *(ushort *)(buff + uVar9 * 2 + (long)(iVar10 + 2)) << 8 |
                  *(ushort *)(buff + uVar9 * 2 + (long)(iVar10 + 2)) >> 8;
          uVar11 = (uint32_t)uVar3;
          std::ostream::operator<<((ostream *)&origin,uVar3);
          bVar1 = (local_218->path_attr).as_path_length;
        }
        bVar2 = true;
        if (bVar1 < 0x40) {
          (local_218->path_attr).as_path_length = bVar1 + 1;
          (local_218->path_attr).as_path[bVar1] = uVar11;
          bVar2 = bVar8;
        }
        bVar8 = bVar2;
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)&as_list_str);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&origin);
      }
      if (bVar8) {
        log<unsigned_char>(WARNING,"Overflowed AS PATH %d",&segment_length);
      }
      _origin = as_list_str._M_dataplus._M_p;
      log<char_const*>(INFO,"AS Path%s",(char **)&origin);
      buff = local_1e0;
      iVar6 = local_20c;
      std::__cxx11::string::~string((string *)&as_list_str);
      break;
    case 3:
      if ((short)local_210 != 4) {
        __assert_fail("attribute_len == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/kametan0730[P]my_awesome_bgp/bgp.cpp"
                      ,0x138,
                      "bool bgp_update_handle_path_attribute(bgp_peer *, const unsigned char *, uint16_t, uint16_t, adj_ribs_in_data &)"
                     );
      }
      __in.s_addr = *(in_addr_t *)(buff + iVar10);
      (local_218->path_attr).next_hop =
           __in.s_addr >> 0x18 | (__in.s_addr & 0xff0000) >> 8 | (__in.s_addr & 0xff00) << 8 |
           __in.s_addr << 0x18;
      _origin = inet_ntoa(__in);
      log<char*>(INFO,"Next Hop %s",(char **)&origin);
      break;
    case 4:
      uVar4 = *(uint *)(buff + iVar10);
      local_1e4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      (local_218->path_attr).med = local_1e4;
      pcVar7 = "MED %d";
      args_00 = &local_1e4;
      goto LAB_0010f9a8;
    case 5:
      uVar4 = *(uint *)(buff + iVar10);
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      _origin = (char *)CONCAT44(uStack_1a7._3_4_,uVar4);
      (local_218->path_attr).local_pref = uVar4;
      pcVar7 = "Local Pref %d";
      args_00 = (uint *)&origin;
LAB_0010f9a8:
      log<unsigned_int>(INFO,pcVar7,args_00);
      break;
    case 6:
      log<>(INFO,"Atomic Aggregate");
      break;
    case 7:
      if (local_1d8->is_4_octet_as_supported == true) {
        uVar4 = *(uint *)(buff + iVar10);
        iVar10 = iVar10 + 4;
      }
      else {
        uVar4 = (uint)*(ushort *)(buff + iVar10);
        iVar10 = iVar10 + 2;
      }
      as_list_str._M_dataplus._M_p._0_4_ = uVar4;
      _origin = inet_ntoa((in_addr)*(in_addr_t *)(buff + iVar10));
      log<unsigned_int,char*>(INFO,"Aggregator %d, %s",(uint *)&as_list_str,(char **)&origin);
      break;
    default:
      goto switchD_0010f6bd_caseD_8;
    case 0x11:
      segment_type = buff[iVar10];
      if (segment_type != '\x02') goto LAB_0010f8f7;
      bVar1 = buff[(long)iVar10 + 1];
      as_list_str._M_dataplus._M_p = (pointer)&as_list_str.field_2;
      as_list_str._M_string_length = 0;
      as_list_str.field_2._M_local_buf[0] = '\0';
      for (uVar9 = 0; bVar1 != uVar9; uVar9 = uVar9 + 1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&origin);
        std::ostream::_M_insert<unsigned_long>((ulong)&origin);
        std::__cxx11::string::append((char *)&as_list_str);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)&as_list_str);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&origin);
      }
      _origin = as_list_str._M_dataplus._M_p;
      log<char_const*>(INFO,"AS4 Path%s",(char **)&origin);
      std::__cxx11::string::~string((string *)&as_list_str);
      buff = local_1e0;
      iVar6 = local_20c;
    }
LAB_0010fa91:
    iVar10 = iVar10 + (local_210 & 0xffff);
  } while( true );
}

Assistant:

bool bgp_update_handle_path_attribute(bgp_peer* peer, const unsigned char* buff, uint16_t unfeasible_routes_length, uint16_t total_path_attribute_length, adj_ribs_in_data& route_data){

    int read_length = 19 + 2 + unfeasible_routes_length + 2;
    while(read_length < 19 + 2 + unfeasible_routes_length + 2 + total_path_attribute_length){
        uint8_t flag = buff[read_length];
        uint8_t type = buff[read_length + 1];
        read_length += 2;
        uint16_t attribute_len;
        if(!(flag & EXTENDED_LENGTH)){
            attribute_len = buff[read_length];
            read_length += 1;
        }else{
            memcpy(&attribute_len, &buff[read_length], 2);
            attribute_len = ntohs(attribute_len);
            read_length += 2;
        }
        switch(type){
            case ORIGIN:{
                uint8_t origin = buff[read_length];
                route_data.path_attr.origin = origin;
                log(log_level::INFO, "Origin %d", origin);
            }
                break;
            case AS_PATH:{
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    bool is_overflowed = false;
                    for(int i = 0; i < segment_length; i++){
                        std::ostringstream oss;
                        as_list_str.append(" ");
                        if(peer->is_4_octet_as_supported){
                            uint32_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                            asn = ntohl(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }else{
                            uint16_t asn;
                            memcpy(&asn, &buff[read_length + 2 + i * 2], 2);
                            asn = ntohs(asn);
                            oss << asn;
                            if(route_data.path_attr.as_path_length < 64){
                                route_data.path_attr.as_path[route_data.path_attr.as_path_length++] = asn;
                            }else{
                                is_overflowed = true;
                            }
                        }
                        as_list_str.append(oss.str());
                    }
                    if(is_overflowed){
                        log(log_level::WARNING, "Overflowed AS PATH %d", segment_length);

                    }
                    log(log_level::INFO, "AS Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            case NEXT_HOP:{
                assert(attribute_len == 4);
                route_data.path_attr.next_hop = buff[read_length]*256*256*256 + buff[read_length + 1]*256*256 + buff[read_length + 2]*256 + buff[read_length + 3];
                log(log_level::INFO, "Next Hop %s", inet_ntoa(in_addr{.s_addr = ntohl(route_data.path_attr.next_hop)}));
            }
                break;
            case MULTI_EXIT_DISC:
                uint32_t med;
                memcpy(&med, &buff[read_length], 4);
                med = ntohl(med);
                route_data.path_attr.med = med;
                log(log_level::INFO, "MED %d", med);
                break;
            case LOCAL_PREF:{
                uint32_t local_pref;
                memcpy(&local_pref, &buff[read_length], 4);
                local_pref = ntohl(local_pref);
                route_data.path_attr.local_pref = local_pref;
                log(log_level::INFO, "Local Pref %d", local_pref);
            }
                break;
            case ATOMIC_AGGREGATE:
                log(log_level::INFO, "Atomic Aggregate");
                break;
            case AGGREGATOR:
            {
                uint32_t asn;
                if(peer->is_4_octet_as_supported){
                    memcpy(&asn, &buff[read_length], 4);
                    read_length += 4;
                }else{
                    uint16_t asn_2;
                    memcpy(&asn_2, &buff[read_length], 2);
                    read_length += 2;
                    asn = asn_2;
                }
                uint32_t address;
                memcpy(&address, &buff[read_length], 4);
                log(log_level::INFO, "Aggregator %d, %s", asn, inet_ntoa(in_addr{.s_addr = address}));
            }
                break;
            case AS4_PATH:
            {
                uint8_t segment_type = buff[read_length];
                uint8_t segment_length = buff[read_length + 1];
                if(segment_type == bgp_path_attribute_as_path_segment_type::AS_SEQUENCE){
                    std::string as_list_str;
                    for(int i = 0; i < segment_length; i++){
                        uint32_t asn;
                        memcpy(&asn, &buff[read_length + 2 + i * 4], 4);
                        asn = ntohl(asn);
                        std::ostringstream oss;
                        oss << asn;
                        as_list_str.append(" ");
                        as_list_str.append(oss.str());
                        /*
                        if(route_data.path_attr.as4_path_length < 64){
                            route_data.path_attr.as4_path[route_data.path_attr.as_path_length++] = asn;
                        }else{
                            log(log_level::WARNING, "Overflowed AS4 PATH %d", segment_length);
                        }*/
                    }
                    log(log_level::INFO, "AS4 Path%s", as_list_str.c_str());
                }else{
                    log(log_level::DEBUG, "Unable to interpret segment type %d", segment_type);
                }
            }
                break;
            default:
                log(log_level::INFO, "Unhandled path attributes type %d", type);
                break;
        }
        read_length += attribute_len;
    }
    return true;
}